

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O3

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadMultiLineText
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char **a_pData,
          char **a_pVal,char *a_pTagName,bool a_bAllowBlankLinesInComment)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  byte *pbVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  byte *pLeft;
  byte *pbVar8;
  byte *__src;
  byte *pbVar9;
  size_t sVar10;
  
  pbVar4 = (byte *)*a_pData;
  *a_pVal = (char *)pbVar4;
  bVar7 = *pbVar4;
  __src = pbVar4;
  while (pLeft = pbVar4, a_pTagName != (char *)0x0) {
LAB_00205d86:
    sVar10 = 0;
    pbVar4 = __src;
    while( true ) {
      bVar7 = *pbVar4;
      if ((bVar7 < 0xe) && ((0x2401U >> (bVar7 & 0x1f) & 1) != 0)) break;
      pbVar4 = pbVar4 + 1;
      *a_pData = (char *)pbVar4;
      sVar10 = sVar10 + 1;
    }
    if (pLeft < __src) {
      memmove(pLeft,__src,sVar10);
      pLeft[sVar10] = 0;
      pbVar4 = (byte *)*a_pData;
      bVar7 = *pbVar4;
    }
    *pbVar4 = 0;
    if (((a_pTagName != (char *)0x0) &&
        (bVar3 = SI_GenericNoCase<char>::operator()
                           ((SI_GenericNoCase<char> *)
                            &CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::
                             IsLess(char_const*,char_const*)::isLess,(char *)pLeft,a_pTagName),
        !bVar3)) &&
       (bVar3 = SI_GenericNoCase<char>::operator()
                          ((SI_GenericNoCase<char> *)
                           &CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::
                            IsLess(char_const*,char_const*)::isLess,a_pTagName,(char *)pLeft),
       !bVar3)) {
      __src = (byte *)*a_pData;
      pbVar8 = pLeft;
LAB_00205f35:
      if ((byte *)*a_pVal == __src) {
        *a_pVal = (char *)0x0;
        return false;
      }
      pbVar8[-1] = 0;
      if (a_pTagName == (char *)0x0) {
        return true;
      }
      if (bVar7 == 0) {
        return true;
      }
      **a_pData = bVar7;
      pcVar2 = *a_pData;
      lVar6 = 1;
      if (*pcVar2 == '\r') {
        lVar6 = (ulong)(pcVar2[1] == '\n') + 1;
      }
      *a_pData = pcVar2 + lVar6;
      return true;
    }
    if (bVar7 == 0) {
      return true;
    }
    pbVar4 = (byte *)*a_pData;
    *pbVar4 = bVar7;
    pcVar2 = *a_pData;
    lVar6 = 1;
    if (*pcVar2 == '\r') {
      lVar6 = (ulong)(pcVar2[1] == '\n') + 1;
    }
    *a_pData = pcVar2 + lVar6;
    pLeft[(long)pbVar4 - (long)__src] = 10;
    pbVar4 = pLeft + ((long)pbVar4 - (long)__src) + 1;
    __src = (byte *)*a_pData;
  }
LAB_00205e7c:
  bVar1 = *__src;
  if ((bVar1 != 0x23) && (bVar1 != 0x3b)) {
    pbVar8 = pbVar4;
    if (a_bAllowBlankLinesInComment) {
      sVar10 = 0;
      pbVar9 = __src;
      do {
        uVar5 = (ulong)bVar1;
        pbVar8 = pLeft;
        if (0x3b < bVar1) break;
        lVar6 = 1;
        if ((0x2400UL >> (uVar5 & 0x3f) & 1) == 0) {
          if ((0x100000200U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_00205edf;
        }
        else {
          sVar10 = (size_t)((int)sVar10 + 1);
          if (bVar1 == 0xd) {
            lVar6 = (ulong)(pbVar9[1] == 10) + 1;
          }
        }
        bVar1 = pbVar9[lVar6];
        pbVar9 = pbVar9 + lVar6;
      } while( true );
    }
    goto LAB_00205f35;
  }
  goto LAB_00205d86;
LAB_00205edf:
  if ((0x800000800000000U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_00205f35;
  if (0 < (int)sVar10) {
    memset(pLeft,10,sVar10);
    pLeft = pLeft + sVar10;
  }
  *a_pData = (char *)pbVar9;
  __src = pbVar9;
  goto LAB_00205e7c;
}

Assistant:

bool
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::LoadMultiLineText(
    SI_CHAR *&          a_pData,
    const SI_CHAR *&    a_pVal,
    const SI_CHAR *     a_pTagName,
    bool                a_bAllowBlankLinesInComment
    ) const
{
    // we modify this data to strip all newlines down to a single '\n'
    // character. This means that on Windows we need to strip out some
    // characters which will make the data shorter.
    // i.e.  LINE1-LINE1\r\nLINE2-LINE2\0 will become
    //       LINE1-LINE1\nLINE2-LINE2\0
    // The pDataLine entry is the pointer to the location in memory that
    // the current line needs to start to run following the existing one.
    // This may be the same as pCurrLine in which case no move is needed.
    SI_CHAR * pDataLine = a_pData;
    SI_CHAR * pCurrLine;

    // value starts at the current line
    a_pVal = a_pData;

    // find the end tag. This tag must start in column 1 and be
    // followed by a newline. No whitespace removal is done while
    // searching for this tag.
    SI_CHAR cEndOfLineChar = *a_pData;
    for(;;) {
        // if we are loading comments then we need a comment character as
        // the first character on every line
        if (!a_pTagName && !IsComment(*a_pData)) {
            // if we aren't allowing blank lines then we're done
            if (!a_bAllowBlankLinesInComment) {
                break;
            }

            // if we are allowing blank lines then we only include them
            // in this comment if another comment follows, so read ahead
            // to find out.
            SI_CHAR * pCurr = a_pData;
            int nNewLines = 0;
            while (IsSpace(*pCurr)) {
                if (IsNewLineChar(*pCurr)) {
                    ++nNewLines;
                    SkipNewLine(pCurr);
                }
                else {
                    ++pCurr;
                }
            }

            // we have a comment, add the blank lines to the output
            // and continue processing from here
            if (IsComment(*pCurr)) {
                for (; nNewLines > 0; --nNewLines) *pDataLine++ = '\n';
                a_pData = pCurr;
                continue;
            }

            // the comment ends here
            break;
        }

        // find the end of this line
        pCurrLine = a_pData;
        while (*a_pData && !IsNewLineChar(*a_pData)) ++a_pData;

        // move this line down to the location that it should be if necessary
        if (pDataLine < pCurrLine) {
            size_t nLen = (size_t) (a_pData - pCurrLine);
            memmove(pDataLine, pCurrLine, nLen * sizeof(SI_CHAR));
            pDataLine[nLen] = '\0';
        }

        // end the line with a NULL
        cEndOfLineChar = *a_pData;
        *a_pData = 0;

        // if are looking for a tag then do the check now. This is done before
        // checking for end of the data, so that if we have the tag at the end
        // of the data then the tag is removed correctly.
        if (a_pTagName &&
            (!IsLess(pDataLine, a_pTagName) && !IsLess(a_pTagName, pDataLine)))
        {
            break;
        }

        // if we are at the end of the data then we just automatically end
        // this entry and return the current data.
        if (!cEndOfLineChar) {
            return true;
        }

        // otherwise we need to process this newline to ensure that it consists
        // of just a single \n character.
        pDataLine += (a_pData - pCurrLine);
        *a_pData = cEndOfLineChar;
        SkipNewLine(a_pData);
        *pDataLine++ = '\n';
    }

    // if we didn't find a comment at all then return false
    if (a_pVal == a_pData) {
        a_pVal = NULL;
        return false;
    }

    // the data (which ends at the end of the last line) needs to be
    // null-terminated BEFORE before the newline character(s). If the
    // user wants a new line in the multi-line data then they need to
    // add an empty line before the tag.
    *--pDataLine = '\0';

    // if looking for a tag and if we aren't at the end of the data,
    // then move a_pData to the start of the next line.
    if (a_pTagName && cEndOfLineChar) {
        SI_ASSERT(IsNewLineChar(cEndOfLineChar));
        *a_pData = cEndOfLineChar;
        SkipNewLine(a_pData);
    }

    return true;
}